

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O0

void __thiscall
AutoArgParse::RepeatedFlagException::~RepeatedFlagException(RepeatedFlagException *this)

{
  RepeatedFlagException *this_local;
  
  *(undefined ***)&this->super_ParseException = &PTR__RepeatedFlagException_001239a0;
  std::__cxx11::string::~string((string *)&this->repeatedFlag);
  ParseException::~ParseException(&this->super_ParseException);
  return;
}

Assistant:

RepeatedFlagException(std::string repeatedFlag)
        : ParseException(REPEATED_FLAG, makeErrorMessage(repeatedFlag)),
          repeatedFlag(std::move(repeatedFlag)) {}